

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O0

Compiler * __thiscall r_comp::Compiler::getError_abi_cxx11_(Compiler *this)

{
  long in_RSI;
  __cxx11 local_98 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38 [40];
  Compiler *this_local;
  
  this_local = this;
  std::operator+(local_78,(char *)(in_RSI + 0x20));
  std::__cxx11::to_string(local_98,*(int *)(in_RSI + 0x40));
  std::operator+(local_58,local_78);
  std::operator+(local_38,(char *)local_58);
  std::operator+(&this->error,local_38);
  std::__cxx11::string::~string((string *)local_38);
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string((string *)local_78);
  return this;
}

Assistant:

std::string Compiler::getError()
{
    return m_errorFile + ":" + std::to_string(m_errorLine) + ": " + error;
}